

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

void Gia_WinCreateFromCut(Gia_Man_t *p,Vec_Int_t *vIn,Vec_Wec_t *vLevels,Vec_Int_t *vWin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int Entry;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Vec_WecSizeSize(vLevels);
  if (iVar1 != 0) {
    __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x3de,
                  "void Gia_WinCreateFromCut(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  vWin->nSize = 0;
  Gia_ManIncrementTravId(p);
  for (iVar1 = 0; iVar1 < vIn->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vIn,iVar1);
    Gia_ObjSetTravIdCurrentId(p,iVar2);
    iVar3 = Gia_ObjLevelId(p,iVar2);
    Vec_WecPush(vLevels,iVar3,iVar2);
    Vec_IntPush(vWin,iVar2);
    iVar2 = Gia_ObjLevelId(p,iVar2);
    Vec_IntPushUniqueOrder(p_00,iVar2);
  }
  iVar1 = 0;
  do {
    if (p_00->nSize <= iVar1) {
      Vec_IntSort(vWin,iVar1);
      Vec_IntFree(p_00);
      return;
    }
    iVar2 = Vec_IntEntry(p_00,iVar1);
    p_01 = Vec_WecEntry(vLevels,iVar2);
    for (iVar2 = 0; iVar2 < p_01->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(p_01,iVar2);
      pObj = Gia_ManObj(p,iVar3);
      if (pObj == (Gia_Obj_t *)0x0) break;
      iVar3 = 0;
      while( true ) {
        iVar4 = Gia_ObjFanoutNum(p,pObj);
        if (iVar4 <= iVar3) break;
        pObj_00 = Gia_ObjFanout(p,pObj,iVar3);
        if (iVar3 == 5) break;
        if ((~*(uint *)pObj_00 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj_00) {
          iVar4 = Gia_ObjIsTravIdCurrent(p,pObj_00);
          if (iVar4 == 0) {
            iVar4 = Gia_ObjIsTravIdCurrent
                              (p,pObj_00 + -(ulong)((uint)*(undefined8 *)pObj_00 & 0x1fffffff));
            if (iVar4 != 0) {
              iVar4 = Gia_ObjIsTravIdCurrent
                                (p,pObj_00 + -(ulong)(*(uint *)&pObj_00->field_0x4 & 0x1fffffff));
              if (iVar4 != 0) {
                Gia_ObjSetTravIdCurrent(p,pObj_00);
                iVar4 = Gia_ObjLevel(p,pObj_00);
                Entry = Gia_ObjId(p,pObj_00);
                Vec_WecPush(vLevels,iVar4,Entry);
                iVar4 = Gia_ObjId(p,pObj_00);
                Vec_IntPush(vWin,iVar4);
                iVar4 = Gia_ObjLevel(p,pObj_00);
                Vec_IntPushUniqueOrder(p_00,iVar4);
              }
            }
          }
        }
        iVar3 = iVar3 + 1;
      }
    }
    p_01->nSize = 0;
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void Gia_WinCreateFromCut( Gia_Man_t * p, Vec_Int_t * vIn, Vec_Wec_t * vLevels, Vec_Int_t * vWin )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, iObj, Level;
    Vec_Int_t * vUsed = Vec_IntAlloc( 100 );
    // precondition:  the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // clean the resulting array
    Vec_IntClear( vWin );
    // start a new trav ID and add nodes to the levelized structure
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vIn, iObj, i )
    {
        Gia_ObjSetTravIdCurrentId( p, iObj );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iObj), iObj );
        Vec_IntPush( vWin, iObj );
        Vec_IntPushUniqueOrder( vUsed, Gia_ObjLevelId(p, iObj) );
    }
    // iterate through all objects and explore their fanouts
    //Vec_WecForEachLevel( vLevels, vLevel, k )
    Vec_IntForEachEntry( vUsed, Level, k )
    {
        vLevel = Vec_WecEntry( vLevels, Level );
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    Vec_IntPush( vWin, Gia_ObjId(p, pFanout) );
                    Vec_IntPushUniqueOrder( vUsed, Gia_ObjLevel(p, pFanout) );
                }
            }
        Vec_IntClear( vLevel );
    }
    Vec_IntSort( vWin, 0 );
    Vec_IntFree( vUsed );
}